

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemMap.cpp
# Opt level: O2

void __thiscall MemMap::MemMap(MemMap *this,string *fname)

{
  int __fd;
  size_t __len;
  uint8_t *puVar1;
  empty_file_error *this_00;
  file_open_error *pfVar2;
  allocator<char> local_49;
  string local_48;
  
  std::__cxx11::string::string((string *)&this->fname,(string *)fname);
  __fd = open((fname->_M_dataplus)._M_p,0,0x180);
  this->fd = __fd;
  if (__fd == -1) {
    pfVar2 = (file_open_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"file open error",&local_49);
    file_open_error::file_open_error(pfVar2,&local_48);
    __cxa_throw(pfVar2,&file_open_error::typeinfo,file_open_error::~file_open_error);
  }
  __len = lseek(__fd,0,2);
  if (__len == 0xffffffffffffffff) {
    close(this->fd);
    pfVar2 = (file_open_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"lseek failed",&local_49)
    ;
    file_open_error::file_open_error(pfVar2,&local_48);
    __cxa_throw(pfVar2,&file_open_error::typeinfo,file_open_error::~file_open_error);
  }
  if (__len == 0) {
    close(this->fd);
    this_00 = (empty_file_error *)__cxa_allocate_exception(0x30);
    empty_file_error::empty_file_error(this_00,fname);
    __cxa_throw(this_00,&empty_file_error::typeinfo,empty_file_error::~empty_file_error);
  }
  this->fsize = __len;
  puVar1 = (uint8_t *)mmap((void *)0x0,__len,1,1,this->fd,0);
  this->mmap_ptr = puVar1;
  if (puVar1 != (uint8_t *)0xffffffffffffffff) {
    return;
  }
  close(this->fd);
  pfVar2 = (file_open_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"mmap failed",&local_49);
  file_open_error::file_open_error(pfVar2,&local_48);
  __cxa_throw(pfVar2,&file_open_error::typeinfo,file_open_error::~file_open_error);
}

Assistant:

MemMap::MemMap(const std::string &fname) : fname(fname) {
    fd = open(fname.c_str(), O_RDONLY, static_cast<mode_t>(0600));

    if (fd == -1) {
        throw file_open_error("file open error");
    }

    off_t fsize_tmp = lseek(fd, 0, SEEK_END);

    if (fsize_tmp == 0) {
        close(fd);
        throw empty_file_error(fname);
    }

    if (fsize_tmp == -1) {
        close(fd);
        throw file_open_error("lseek failed");
    }

    fsize = static_cast<uint64_t>(fsize_tmp);
    mmap_ptr = static_cast<uint8_t *>(
        mmap(nullptr, fsize, PROT_READ, MAP_SHARED, fd, 0));

    if (mmap_ptr == MAP_FAILED) {
        close(fd);
        throw file_open_error("mmap failed");
    }
}